

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

void lddmc_refs_tasks_up(lddmc_refs_internal_t lddmc_refs_key)

{
  lddmc_refs_task_t plVar1;
  long lVar2;
  
  lVar2 = (long)lddmc_refs_key->send - (long)lddmc_refs_key->sbegin;
  plVar1 = (lddmc_refs_task_t)realloc(lddmc_refs_key->sbegin,lVar2 * 2);
  lddmc_refs_key->sbegin = plVar1;
  lddmc_refs_key->scur = (lddmc_refs_task_t)((long)plVar1 + lVar2);
  lddmc_refs_key->send = (lddmc_refs_task_t)((long)plVar1 + lVar2 * 2);
  return;
}

Assistant:

void __attribute__((noinline))
lddmc_refs_tasks_up(lddmc_refs_internal_t lddmc_refs_key)
{
    long size = lddmc_refs_key->send - lddmc_refs_key->sbegin;
    lddmc_refs_key->sbegin = (lddmc_refs_task_t)realloc(lddmc_refs_key->sbegin, sizeof(struct lddmc_refs_task) * size * 2);
    lddmc_refs_key->scur = lddmc_refs_key->sbegin + size;
    lddmc_refs_key->send = lddmc_refs_key->sbegin + (size * 2);
}